

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscroller.cpp
# Opt level: O2

void __thiscall QScroller::scrollTo(QScroller *this,QPointF *pos,int scrollTime)

{
  qreal *this_00;
  qreal *this_01;
  QScrollerPrivate *this_02;
  qreal qVar1;
  qreal qVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  QDebug *pQVar6;
  State newstate;
  long in_FS_OFFSET;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  QPointF QVar7;
  QPointF local_98;
  undefined4 uStack_88;
  undefined4 local_84;
  char *local_80;
  QDebug local_70;
  QPointF local_68;
  QPointF local_58;
  QPointF local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_02 = this->d_ptr;
  if (1 < this_02->state - Pressed) {
    if (this_02->state == Inactive) {
      local_98.xp._0_4_ = 0;
      local_98.xp._4_4_ = 0;
      local_98.yp._0_4_ = 0;
      local_98.yp._4_4_ = 0;
      bVar3 = QScrollerPrivate::prepareScrolling(this_02,&local_98);
      if (!bVar3) goto LAB_005db30f;
    }
    QVar7 = clampToRect(pos,&this_02->contentPosRange);
    local_48.xp = QVar7.xp;
    local_48.yp = QVar7.yp;
    qVar1 = QScrollerPrivate::nextSnapPos(this_02,local_48.xp,0,Horizontal);
    qVar2 = QScrollerPrivate::nextSnapPos(this_02,QVar7.yp,0,Vertical);
    cVar4 = qIsNaN(qVar1);
    if (cVar4 == '\0') {
      local_48.xp = qVar1;
    }
    cVar4 = qIsNaN(qVar2);
    if (cVar4 == '\0') {
      local_48.yp = qVar2;
    }
    lcScroller();
    if (((byte)lcScroller::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
      local_98.xp._0_4_ = 2;
      local_98.xp._4_4_ = 0;
      local_98.yp._0_4_ = 0;
      local_98.yp._4_4_ = 0;
      uStack_88 = 0;
      local_84 = 0;
      local_80 = lcScroller::category.name;
      QMessageLogger::debug();
      pQVar6 = QDebug::operator<<(&local_70,"QScroller::scrollTo(req:");
      local_68.xp = (qreal)pQVar6->stream;
      *(int *)((long)local_68.xp + 0x28) = *(int *)((long)local_68.xp + 0x28) + 1;
      this_00 = &local_68.yp;
      ::operator<<((QDebug)this_00,&local_68);
      pQVar6 = QDebug::operator<<((QDebug *)this_00," [pix] / snap:");
      local_58.xp = (qreal)pQVar6->stream;
      *(int *)((long)local_58.xp + 0x28) = *(int *)((long)local_58.xp + 0x28) + 1;
      this_01 = &local_58.yp;
      ::operator<<((QDebug)this_01,&local_58);
      pQVar6 = QDebug::operator<<((QDebug *)this_01,", ");
      pQVar6 = QDebug::operator<<(pQVar6,scrollTime);
      QDebug::operator<<(pQVar6," [ms])");
      QDebug::~QDebug((QDebug *)this_01);
      QDebug::~QDebug((QDebug *)&local_58);
      QDebug::~QDebug((QDebug *)this_00);
      QDebug::~QDebug((QDebug *)&local_68);
      QDebug::~QDebug(&local_70);
    }
    local_98.xp = (this_02->overshootPosition).xp + (this_02->contentPosition).xp;
    local_98.yp = (this_02->overshootPosition).yp + (this_02->contentPosition).yp;
    bVar3 = qFuzzyCompare(&local_48,&local_98);
    if (!bVar3) {
      QVar7 = velocity(this);
      newstate = Inactive;
      iVar5 = 0;
      if (0 < scrollTime) {
        iVar5 = scrollTime;
      }
      QScrollerPrivate::createScrollToSegments
                (this_02,QVar7.xp,(double)iVar5 / 1000.0,local_48.xp,Horizontal,ScrollTypeScrollTo);
      QScrollerPrivate::createScrollToSegments
                (this_02,(qreal)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da),(double)iVar5 / 1000.0,
                 local_48.yp,Vertical,ScrollTypeScrollTo);
      if (scrollTime < 1) {
        QScrollerPrivate::setContentPositionHelperScrolling(this_02);
      }
      else {
        newstate = Scrolling;
      }
      QScrollerPrivate::setState(this_02,newstate);
    }
  }
LAB_005db30f:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QScroller::scrollTo(const QPointF &pos, int scrollTime)
{
    Q_D(QScroller);

    if (d->state == Pressed || d->state == Dragging )
        return;

    // no need to resend a prepare event if we are already scrolling
    if (d->state == Inactive && !d->prepareScrolling(QPointF()))
        return;

    QPointF newpos = clampToRect(pos, d->contentPosRange);
    qreal snapX = d->nextSnapPos(newpos.x(), 0, Qt::Horizontal);
    qreal snapY = d->nextSnapPos(newpos.y(), 0, Qt::Vertical);
    if (!qIsNaN(snapX))
        newpos.setX(snapX);
    if (!qIsNaN(snapY))
        newpos.setY(snapY);

    qCDebug(lcScroller) << "QScroller::scrollTo(req:" << pos << " [pix] / snap:"
                        << newpos << ", " << scrollTime << " [ms])";

    if (newpos == d->contentPosition + d->overshootPosition)
        return;

    QPointF vel = velocity();

    if (scrollTime < 0)
        scrollTime = 0;
    qreal time = qreal(scrollTime) / 1000;

    d->createScrollToSegments(vel.x(), time, newpos.x(), Qt::Horizontal, QScrollerPrivate::ScrollTypeScrollTo);
    d->createScrollToSegments(vel.y(), time, newpos.y(), Qt::Vertical, QScrollerPrivate::ScrollTypeScrollTo);

    if (!scrollTime)
        d->setContentPositionHelperScrolling();
    d->setState(scrollTime ? Scrolling : Inactive);
}